

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

Construct * __thiscall
spvtools::val::Function::FindConstructForEntryBlock
          (Function *this,BasicBlock *entry_block,ConstructType type)

{
  iterator iVar1;
  key_type local_10;
  
  local_10.first = entry_block;
  local_10.second = type;
  iVar1 = std::
          _Hashtable<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_std::allocator<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>_>,_spvtools::val::bb_constr_type_pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->entry_block_to_construct_)._M_h,&local_10);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    __assert_fail("where != entry_block_to_construct_.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                  ,0x137,
                  "Construct &spvtools::val::Function::FindConstructForEntryBlock(const BasicBlock *, ConstructType)"
                 );
  }
  if (*(Construct **)
       ((long)iVar1.
              super__Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
              ._M_cur + 0x18) != (Construct *)0x0) {
    return *(Construct **)
            ((long)iVar1.
                   super__Node_iterator_base<std::pair<const_std::pair<const_spvtools::val::BasicBlock_*,_spvtools::val::ConstructType>,_spvtools::val::Construct_*>,_true>
                   ._M_cur + 0x18);
  }
  __assert_fail("construct_ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                ,0x139,
                "Construct &spvtools::val::Function::FindConstructForEntryBlock(const BasicBlock *, ConstructType)"
               );
}

Assistant:

Construct& Function::FindConstructForEntryBlock(const BasicBlock* entry_block,
                                                ConstructType type) {
  auto where =
      entry_block_to_construct_.find(std::make_pair(entry_block, type));
  assert(where != entry_block_to_construct_.end());
  auto construct_ptr = (*where).second;
  assert(construct_ptr);
  return *construct_ptr;
}